

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printSummaryDivider(ConsoleReporter *this)

{
  ostream *poVar1;
  
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam00000000001c9a30 = 0x2d2d2d2d2d2d2d;
    uRam00000000001c9a37 = 0x2d2d2d2d2d2d2d2d;
    _DAT_001c9a20 = 0x2d2d2d2d2d2d2d2d;
    uRam00000000001c9a28 = 0x2d2d2d2d2d2d2d;
    DAT_001c9a2f = 0x2d;
    _DAT_001c9a10 = 0x2d2d2d2d2d2d2d2d;
    uRam00000000001c9a18 = 0x2d2d2d2d2d2d2d2d;
    _DAT_001c9a00 = 0x2d2d2d2d2d2d2d2d;
    uRam00000000001c9a08 = 0x2d2d2d2d2d2d2d2d;
    _line = 0x2d2d2d2d2d2d2d2d;
    uRam00000000001c99f8 = 0x2d2d2d2d2d2d2d2d;
    DAT_001c9a3f = 0;
  }
  poVar1 = std::operator<<((this->super_StreamingReporterBase).stream,
                           &getLineOfChars<(char)45>()::line);
  std::operator<<(poVar1,"\n");
  return;
}

Assistant:

void printSummaryDivider() {
            stream << getLineOfChars<'-'>() << "\n";
        }